

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::~cmake(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  cmMessenger *__ptr;
  cmFileAPI *__ptr_00;
  pointer pcVar3;
  _Manager_type p_Var4;
  pointer ppcVar5;
  
  std::unique_ptr<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>::
  ~unique_ptr(&this->ProfilingOutput);
  pcVar2 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  if (pcVar2 != (cmGlobalGenerator *)0x0) {
    (*pcVar2->_vptr_cmGlobalGenerator[1])();
  }
  (this->GlobalGenerator)._M_t.
  super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)0x0;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&(this->CheckInProgressMessages).c);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->DebugFindVars)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->DebugFindPkgs)._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->TraceOnlyThisSources);
  __ptr = (this->Messenger)._M_t.
          super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
          super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
          super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (__ptr != (cmMessenger *)0x0) {
    std::default_delete<cmMessenger>::operator()
              ((default_delete<cmMessenger> *)&this->Messenger,__ptr);
  }
  (this->Messenger)._M_t.super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
  super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
  super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl = (cmMessenger *)0x0;
  std::unique_ptr<cmState,_std::default_delete<cmState>_>::~unique_ptr(&this->State);
  __ptr_00 = (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>.
             _M_t.super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
             super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl;
  if (__ptr_00 != (cmFileAPI *)0x0) {
    std::default_delete<cmFileAPI>::operator()((default_delete<cmFileAPI> *)&this->FileAPI,__ptr_00)
    ;
  }
  (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
  super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
  super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl = (cmFileAPI *)0x0;
  std::unique_ptr<cmVariableWatch,_std::default_delete<cmVariableWatch>_>::~unique_ptr
            (&this->VariableWatch);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Rb_tree(&(this->UnprocessedPresetEnvironment)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  ::~_Rb_tree(&(this->UnprocessedPresetVariables)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
  ::~_Rb_tree(&(this->InstalledFiles)._M_t);
  pcVar3 = (this->GraphVizFile)._M_dataplus._M_p;
  paVar1 = &(this->GraphVizFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>::~unique_ptr
            (&this->FileTimeCache);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->HipFileExtensions).unordered._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->HipFileExtensions).ordered);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->FortranFileExtensions).unordered._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->FortranFileExtensions).ordered);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->ISPCFileExtensions).unordered._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->ISPCFileExtensions).ordered);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->CudaFileExtensions).unordered._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->CudaFileExtensions).ordered);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->HeaderFileExtensions).unordered._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->HeaderFileExtensions).ordered);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->CLikeSourceFileExtensions).unordered._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->CLikeSourceFileExtensions).ordered);
  pcVar3 = (this->EnvironmentGenerator)._M_dataplus._M_p;
  paVar1 = &(this->EnvironmentGenerator).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->VSSolutionFile)._M_dataplus._M_p;
  paVar1 = &(this->VSSolutionFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->CheckStampList)._M_dataplus._M_p;
  paVar1 = &(this->CheckStampList).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->CheckStampFile)._M_dataplus._M_p;
  paVar1 = &(this->CheckStampFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->CheckBuildSystemArgument)._M_dataplus._M_p;
  paVar1 = &(this->CheckBuildSystemArgument).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->CCEnvironment)._M_dataplus._M_p;
  paVar1 = &(this->CCEnvironment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->CXXEnvironment)._M_dataplus._M_p;
  paVar1 = &(this->CXXEnvironment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->CMakeEditCommand)._M_dataplus._M_p;
  paVar1 = &(this->CMakeEditCommand).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&(this->UsedCliVariables)._M_t);
  cmGeneratedFileStream::~cmGeneratedFileStream(&this->TraceFile);
  p_Var4 = (this->ProgressCallback).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->ProgressCallback,(_Any_data *)&this->ProgressCallback,
              __destroy_functor);
  }
  pcVar3 = (this->CMakeWorkingDirectory)._M_dataplus._M_p;
  paVar1 = &(this->CMakeWorkingDirectory).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->GeneratorToolset)._M_dataplus._M_p;
  paVar1 = &(this->GeneratorToolset).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->GeneratorPlatform)._M_dataplus._M_p;
  paVar1 = &(this->GeneratorPlatform).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->GeneratorInstance)._M_dataplus._M_p;
  paVar1 = &(this->GeneratorInstance).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  ::~_Rb_tree(&(this->DiagLevels)._M_t);
  ppcVar5 = (this->ExtraGenerators).
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar5 != (pointer)0x0) {
    operator_delete(ppcVar5,(long)(this->ExtraGenerators).
                                  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar5
                   );
  }
  std::
  vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ::~vector(&this->Generators);
  return;
}

Assistant:

cmake::~cmake() = default;